

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O0

void Omega_h::migrate_mesh(Mesh *mesh,Dist *new_elems2old_owners,Omega_h_Parting mode,bool verbose)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Int IVar4;
  char *file;
  allocator local_c19;
  string local_c18 [36];
  int local_bf4;
  undefined1 local_bf0 [4];
  Int d_2;
  Dist local_b60;
  LO local_acc;
  undefined1 local_ac8 [4];
  LO nnew_verts;
  Dist new_verts2old_owners;
  Dist local_9a8;
  Dist local_918;
  Adj local_888;
  Dist local_858;
  undefined1 local_7c8 [8];
  Dist old_low_owners2new_lows;
  Adj high2low;
  undefined1 local_700 [4];
  Int d_1;
  Dist old_owners2new_ents;
  Dist new_ents2old_owners;
  shared_ptr<Omega_h::Comm> local_550;
  Int local_53c;
  undefined1 local_538 [4];
  Int dim;
  CommPtr comm;
  Mesh new_mesh;
  string local_148 [36];
  int local_124;
  __cxx11 local_120 [4];
  Int d;
  allocator local_e9;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [34];
  ScopedTimer local_86;
  byte local_85;
  Omega_h_Parting local_84;
  ScopedTimer omega_h_scoped_function_timer;
  bool verbose_local;
  Dist *pDStack_80;
  Omega_h_Parting mode_local;
  Dist *new_elems2old_owners_local;
  Mesh *mesh_local;
  
  local_85 = verbose;
  local_84 = mode;
  pDStack_80 = new_elems2old_owners;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
             ,&local_e9);
  std::operator+(local_c8,(char *)local_e8);
  std::__cxx11::to_string(local_120,0xc3);
  std::operator+(local_a8,local_c8);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_86,"migrate_mesh",file);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_124 = 0;
  while( true ) {
    iVar1 = local_124;
    IVar4 = Mesh::dim(mesh);
    iVar2 = local_124;
    if (IVar4 < iVar1) {
      Mesh::copy_meta((Mesh *)&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,mesh);
      Mesh::comm((Mesh *)local_538);
      local_53c = Mesh::dim(mesh);
      if ((local_85 & 1) != 0) {
        std::shared_ptr<Omega_h::Comm>::shared_ptr
                  (&local_550,(shared_ptr<Omega_h::Comm> *)local_538);
        Dist::Dist((Dist *)&new_ents2old_owners.comm_[1].
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,new_elems2old_owners);
        print_migrate_stats(&local_550,
                            (Dist *)&new_ents2old_owners.comm_[1].
                                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
        Dist::~Dist((Dist *)&new_ents2old_owners.comm_[1].
                             super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_550);
      }
      Dist::Dist((Dist *)&old_owners2new_ents.comm_[1].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 new_elems2old_owners);
      Dist::invert((Dist *)local_700,
                   (Dist *)&old_owners2new_ents.comm_[1].
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      for (high2low.codes.write_.shared_alloc_.direct_ptr._4_4_ = local_53c;
          0 < high2low.codes.write_.shared_alloc_.direct_ptr._4_4_;
          high2low.codes.write_.shared_alloc_.direct_ptr._4_4_ =
               high2low.codes.write_.shared_alloc_.direct_ptr._4_4_ + -1) {
        old_low_owners2new_lows.comm_[1].
        super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Dist::Dist((Dist *)local_7c8);
        Dist::Dist(&local_858,(Dist *)local_700);
        push_down(mesh,high2low.codes.write_.shared_alloc_.direct_ptr._4_4_,
                  high2low.codes.write_.shared_alloc_.direct_ptr._4_4_ + -1,&local_858,
                  (Adj *)&old_low_owners2new_lows.comm_[1].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  (Dist *)local_7c8);
        Dist::~Dist(&local_858);
        Adj::Adj(&local_888,
                 (Adj *)&old_low_owners2new_lows.comm_[1].
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        Mesh::set_ents((Mesh *)&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,high2low.codes.write_.shared_alloc_.direct_ptr._4_4_,
                       &local_888);
        Adj::~Adj(&local_888);
        Dist::invert(&local_918,(Dist *)local_700);
        Dist::operator=((Dist *)&old_owners2new_ents.comm_[1].
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,&local_918);
        Dist::~Dist(&local_918);
        Dist::Dist(&local_9a8,
                   (Dist *)&old_owners2new_ents.comm_[1].
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        Dist::Dist((Dist *)&new_verts2old_owners.comm_[1].
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Dist *)local_700);
        push_ents(mesh,(Mesh *)&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,high2low.codes.write_.shared_alloc_.direct_ptr._4_4_,
                  &local_9a8,
                  (Dist *)&new_verts2old_owners.comm_[1].
                           super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ,local_84);
        Dist::~Dist((Dist *)&new_verts2old_owners.comm_[1].
                             super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        Dist::~Dist(&local_9a8);
        Dist::operator=((Dist *)local_700,(Dist *)local_7c8);
        Dist::~Dist((Dist *)local_7c8);
        Adj::~Adj((Adj *)&old_low_owners2new_lows.comm_[1].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      Dist::invert((Dist *)local_ac8,(Dist *)local_700);
      local_acc = Dist::nitems((Dist *)local_ac8);
      Mesh::set_verts((Mesh *)&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,local_acc);
      Dist::Dist(&local_b60,(Dist *)local_ac8);
      Dist::Dist((Dist *)local_bf0,(Dist *)local_700);
      push_ents(mesh,(Mesh *)&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,0,&local_b60,(Dist *)local_bf0,local_84);
      Dist::~Dist((Dist *)local_bf0);
      Dist::~Dist(&local_b60);
      Mesh::operator=(mesh,(Mesh *)&comm.
                                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
      local_bf4 = 0;
      while( true ) {
        iVar1 = local_bf4;
        IVar4 = Mesh::dim(mesh);
        iVar2 = local_bf4;
        if (IVar4 < iVar1) {
          Dist::~Dist((Dist *)local_ac8);
          Dist::~Dist((Dist *)local_700);
          Dist::~Dist((Dist *)&old_owners2new_ents.comm_[1].
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_538);
          Mesh::~Mesh((Mesh *)&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          ScopedTimer::~ScopedTimer(&local_86);
          return;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c18,"global",&local_c19);
        bVar3 = Mesh::has_tag(mesh,iVar2,(string *)local_c18);
        if (!bVar3) break;
        std::__cxx11::string::~string(local_c18);
        std::allocator<char>::~allocator((allocator<char> *)&local_c19);
        local_bf4 = local_bf4 + 1;
      }
      fail("assertion %s failed at %s +%d\n","mesh->has_tag(d, \"global\")",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
           ,0xdf);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_148,"global",
               (allocator *)
               ((long)&new_mesh.class_sets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    bVar3 = Mesh::has_tag(mesh,iVar2,(string *)local_148);
    if (!bVar3) break;
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&new_mesh.class_sets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    local_124 = local_124 + 1;
  }
  fail("assertion %s failed at %s +%d\n","mesh->has_tag(d, \"global\")",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
       ,0xc5);
}

Assistant:

void migrate_mesh(
    Mesh* mesh, Dist new_elems2old_owners, Omega_h_Parting mode, bool verbose) {
  OMEGA_H_TIME_FUNCTION;
  for (Int d = 0; d <= mesh->dim(); ++d) {
    OMEGA_H_CHECK(mesh->has_tag(d, "global"));
  }
  auto new_mesh = mesh->copy_meta();
  auto comm = mesh->comm();
  auto dim = mesh->dim();
  if (verbose) print_migrate_stats(comm, new_elems2old_owners);
  Dist new_ents2old_owners = new_elems2old_owners;
  auto old_owners2new_ents = new_ents2old_owners.invert();
  for (Int d = dim; d > VERT; --d) {
    Adj high2low;
    Dist old_low_owners2new_lows;
    push_down(
        mesh, d, d - 1, old_owners2new_ents, high2low, old_low_owners2new_lows);
    new_mesh.set_ents(d, high2low);
    new_ents2old_owners = old_owners2new_ents.invert();
    push_ents(
        mesh, &new_mesh, d, new_ents2old_owners, old_owners2new_ents, mode);
    old_owners2new_ents = old_low_owners2new_lows;
  }
  auto new_verts2old_owners = old_owners2new_ents.invert();
  auto nnew_verts = new_verts2old_owners.nitems();
  new_mesh.set_verts(nnew_verts);
  push_ents(
      mesh, &new_mesh, VERT, new_verts2old_owners, old_owners2new_ents, mode);
  *mesh = new_mesh;
  for (Int d = 0; d <= mesh->dim(); ++d) {
    OMEGA_H_CHECK(mesh->has_tag(d, "global"));
  }
}